

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon.c
# Opt level: O0

void JPCommon_make_label(JPCommon *jpcommon)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  char *in_RDI;
  JPCommonLabel *unaff_retaddr;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  JPCommonNode *node;
  JPCommonLabel *in_stack_00000508;
  int acc;
  undefined4 in_stack_ffffffffffffffe8;
  JPCommonNode *node_00;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    pvVar2 = calloc(1,0x68);
    *(void **)(in_RDI + 0x10) = pvVar2;
  }
  else {
    JPCommonLabel_clear((JPCommonLabel *)CONCAT44(in_stack_00000014,in_stack_00000010));
  }
  JPCommonLabel_initialize(*(JPCommonLabel **)(in_RDI + 0x10));
  for (node_00 = *(JPCommonNode **)in_RDI; node_00 != (JPCommonNode *)0x0; node_00 = node_00->next)
  {
    JPCommonNode_get_pron(node_00);
    JPCommonNode_get_pos(node_00);
    pcVar3 = JPCommonNode_get_ctype(node_00);
    acc = (int)((ulong)pcVar3 >> 0x20);
    pcVar3 = JPCommonNode_get_cform(node_00);
    iVar1 = JPCommonNode_get_acc(node_00);
    JPCommonNode_get_chain_flag(node_00);
    JPCommonLabel_push_word
              (unaff_retaddr,in_RDI,(char *)node_00,
               (char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),pcVar3,acc,in_stack_00000010);
  }
  JPCommonLabel_make(in_stack_00000508);
  return;
}

Assistant:

void JPCommon_make_label(JPCommon * jpcommon)
{
   JPCommonNode *node = jpcommon->head;

   /* initialize */
   if (jpcommon->label != NULL)
      JPCommonLabel_clear(jpcommon->label);
   else
      jpcommon->label = (JPCommonLabel *) calloc(1, sizeof(JPCommonLabel));
   JPCommonLabel_initialize(jpcommon->label);
   /* push word */
   for (node = jpcommon->head; node != NULL; node = node->next)
      JPCommonLabel_push_word(jpcommon->label, JPCommonNode_get_pron(node),
                              JPCommonNode_get_pos(node),
                              JPCommonNode_get_ctype(node),
                              JPCommonNode_get_cform(node),
                              JPCommonNode_get_acc(node), JPCommonNode_get_chain_flag(node));
   /* make label */
   JPCommonLabel_make(jpcommon->label);
}